

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_utils.cpp
# Opt level: O0

void CS248::checkGLError(string *str,bool abort_program_if_error)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uchar *puVar4;
  byte in_SIL;
  string *in_RDI;
  bool has_error;
  GLenum err;
  
  bVar1 = false;
  while (iVar2 = glGetError(), iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"*** GL error:");
    poVar3 = std::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3," : ");
    puVar4 = (uchar *)gluErrorString(iVar2);
    poVar3 = std::operator<<(poVar3,puVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = true;
  }
  if ((bVar1) && ((in_SIL & 1) != 0)) {
    exit(1);
  }
  return;
}

Assistant:

void checkGLError(const std::string& str, bool abort_program_if_error) {
  GLenum err;
  bool has_error = false;
  do {
    err = glGetError();
    if (err != GL_NO_ERROR) {
       cerr << "*** GL error:" << str << " : " << gluErrorString(err) << endl;
       has_error = true;
	  }
  } while (err != GL_NO_ERROR);
  if (has_error && abort_program_if_error) {
    exit(1);
  }
}